

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.c++
# Opt level: O3

DispatchCallResult __thiscall
capnproto_test::capnp::test::TestInterface::Server::dispatchCallInternal
          (Server *this,uint16_t methodId,CallContext<capnp::AnyPointer,_capnp::AnyPointer> context)

{
  long lVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined6 in_register_00000032;
  DispatchCallResult DVar3;
  undefined8 uVar2;
  
  lVar1 = *(long *)CONCAT62(in_register_00000032,methodId);
  switch((ulong)context.hook & 0xffffffff) {
  case 0:
    (**(code **)(lVar1 + 8))(this);
    uVar2 = extraout_RDX;
    break;
  case 1:
    (**(code **)(lVar1 + 0x10))(this);
    uVar2 = extraout_RDX_03;
    break;
  case 2:
    (**(code **)(lVar1 + 0x18))(this);
    uVar2 = extraout_RDX_01;
    break;
  case 3:
    (**(code **)(lVar1 + 0x20))(this);
    uVar2 = extraout_RDX_02;
    break;
  case 4:
    (**(code **)(lVar1 + 0x28))(this);
    uVar2 = extraout_RDX_00;
    break;
  case 5:
    (**(code **)(lVar1 + 0x30))(this);
    uVar2 = extraout_RDX_04;
    break;
  case 6:
    (**(code **)(lVar1 + 0x38))(this);
    uVar2 = extraout_RDX_05;
    break;
  default:
    DVar3 = ::capnp::Capability::Server::internalUnimplemented
                      ((Server *)this,
                       (char *)((long)CONCAT62(in_register_00000032,methodId) +
                               *(long *)(lVar1 + -0x18)),0x2e2b3f,0x92b2);
    uVar2 = DVar3._8_8_;
    goto LAB_00213586;
  }
  *(undefined2 *)&this->field_0x8 = 0;
LAB_00213586:
  DVar3.isStreaming = (bool)(char)uVar2;
  DVar3.allowCancellation = (bool)(char)((ulong)uVar2 >> 8);
  DVar3._10_6_ = (int6)((ulong)uVar2 >> 0x10);
  DVar3.promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)this;
  return DVar3;
}

Assistant:

::capnp::Capability::Server::DispatchCallResult TestInterface::Server::dispatchCallInternal(
    uint16_t methodId,
    ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context) {
  switch (methodId) {
    case 0:
      return {
        foo(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestInterface::FooParams,  ::capnproto_test::capnp::test::TestInterface::FooResults>(context)),
        false,
        false
      };
    case 1:
      return {
        bar(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestInterface::BarParams,  ::capnproto_test::capnp::test::TestInterface::BarResults>(context)),
        false,
        false
      };
    case 2:
      return {
        baz(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestInterface::BazParams,  ::capnproto_test::capnp::test::TestInterface::BazResults>(context)),
        false,
        false
      };
    case 3:
      return {
        getTestPipeline(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestInterface::GetTestPipelineParams,  ::capnproto_test::capnp::test::TestInterface::GetTestPipelineResults>(context)),
        false,
        false
      };
    case 4:
      return {
        getTestTailCallee(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestInterface::GetTestTailCalleeParams,  ::capnproto_test::capnp::test::TestInterface::GetTestTailCalleeResults>(context)),
        false,
        false
      };
    case 5:
      return {
        getTestTailCaller(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestInterface::GetTestTailCallerParams,  ::capnproto_test::capnp::test::TestInterface::GetTestTailCallerResults>(context)),
        false,
        false
      };
    case 6:
      return {
        getTestMoreStuff(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestInterface::GetTestMoreStuffParams,  ::capnproto_test::capnp::test::TestInterface::GetTestMoreStuffResults>(context)),
        false,
        false
      };
    default:
      (void)context;
      return ::capnp::Capability::Server::internalUnimplemented(
          "capnp/test.capnp:TestInterface",
          0x88eb12a0e0af92b2ull, methodId);
  }
}